

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  string_view name;
  bool bVar1;
  Descriptor *type_00;
  ostream *poVar2;
  Message *pMVar3;
  pointer pMVar4;
  MessageLite *pMVar5;
  type message_00;
  ErrorPrinter *local_238;
  undefined1 local_208 [8];
  CodedOutputStream coded_out;
  undefined1 local_190 [8];
  Parser parser;
  ErrorPrinter error_collector;
  FileOutputStream out;
  FileInputStream in;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_80;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> message;
  DynamicMessageFactory dynamic_factory;
  Descriptor *type;
  DescriptorPool *pool_local;
  CommandLineInterface *this_local;
  
  name = (string_view)
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->codec_type_);
  type_00 = DescriptorPool::FindMessageTypeByName(pool,name);
  if (type_00 == (Descriptor *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->codec_type_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
    goto LAB_001463d8;
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&message,pool);
  pMVar3 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&message,type_00);
  pMVar3 = Message::New(pMVar3);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )&local_80,pMVar3);
  if (this->mode_ == MODE_ENCODE) {
    anon_unknown_5::SetFdToTextMode(0);
    anon_unknown_5::SetFdToBinaryMode(1);
  }
  else {
    anon_unknown_5::SetFdToBinaryMode(0);
    anon_unknown_5::SetFdToTextMode(1);
  }
  io::FileInputStream::FileInputStream((FileInputStream *)&out.copying_output_.errno_,0,-1);
  io::FileOutputStream::FileOutputStream((FileOutputStream *)&error_collector.found_errors_,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    ErrorPrinter::ErrorPrinter
              ((ErrorPrinter *)&parser.no_op_fields_,this->error_format_,(DiskSourceTree *)0x0);
    TextFormat::Parser::Parser((Parser *)local_190);
    local_238 = (ErrorPrinter *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x160) {
      local_238 = &error_collector;
    }
    TextFormat::Parser::RecordErrorsTo((Parser *)local_190,(ErrorCollector *)local_238);
    TextFormat::Parser::AllowPartialMessage((Parser *)local_190,true);
    pMVar4 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get(&local_80);
    bVar1 = TextFormat::Parser::Parse
                      ((Parser *)local_190,(ZeroCopyInputStream *)&out.copying_output_.errno_,pMVar4
                      );
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    TextFormat::Parser::~Parser((Parser *)local_190);
    ErrorPrinter::~ErrorPrinter((ErrorPrinter *)&parser.no_op_fields_);
    if (bVar1) {
LAB_0014613b:
      pMVar5 = &std::
                unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                ::operator->(&local_80)->super_MessageLite;
      bVar1 = MessageLite::IsInitialized(pMVar5);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        pMVar4 = std::
                 unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 ::operator->(&local_80);
        Message::InitializationErrorString_abi_cxx11_((string *)&coded_out.start_count_,pMVar4);
        poVar2 = std::operator<<(poVar2,(string *)&coded_out.start_count_);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&coded_out.start_count_);
      }
      if (this->mode_ == MODE_ENCODE) {
        io::CodedOutputStream::CodedOutputStream<google::protobuf::io::FileOutputStream,void>
                  ((CodedOutputStream *)local_208,(FileOutputStream *)&error_collector.found_errors_
                  );
        io::CodedOutputStream::SetSerializationDeterministic
                  ((CodedOutputStream *)local_208,(bool)(this->deterministic_output_ & 1));
        pMVar5 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->(&local_80)->super_MessageLite;
        bVar1 = MessageLite::SerializePartialToCodedStream(pMVar5,(CodedOutputStream *)local_208);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
        }
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_208);
        if (bVar1) {
LAB_00146372:
          this_local._7_1_ = 1;
        }
      }
      else {
        message_00 = std::
                     unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     ::operator*(&local_80);
        bVar1 = TextFormat::Print(message_00,(ZeroCopyOutputStream *)&error_collector.found_errors_)
        ;
        if (bVar1) goto LAB_00146372;
        poVar2 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    pMVar5 = &std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator->(&local_80)->super_MessageLite;
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream
                      (pMVar5,(ZeroCopyInputStream *)&out.copying_output_.errno_);
    if (bVar1) goto LAB_0014613b;
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)&error_collector.found_errors_);
  io::FileInputStream::~FileInputStream((FileInputStream *)&out.copying_output_.errno_);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr(&local_80);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&message);
LAB_001463d8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == nullptr) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    io::CodedOutputStream coded_out(&out);
    coded_out.SetSerializationDeterministic(deterministic_output_);
    if (!message->SerializePartialToCodedStream(&coded_out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}